

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O3

int tpm_socket_read(TPM_SOCKET_HANDLE handle,uchar *tpm_bytes,uint32_t bytes_len)

{
  uchar **ppuVar1;
  ulong uVar2;
  bool bVar3;
  LOGGER_LOG p_Var4;
  ssize_t sVar5;
  uchar *puVar6;
  uchar *__dest;
  int iVar7;
  ulong __size;
  char *pcVar8;
  size_t sVar9;
  bool bVar10;
  size_t sVar11;
  ulong __n;
  undefined1 local_438 [1032];
  
  __n = (ulong)bytes_len;
  if (bytes_len == 0 || (tpm_bytes == (uchar *)0x0 || handle == (TPM_SOCKET_HANDLE)0x0)) {
    p_Var4 = xlogging_get_log_function();
    iVar7 = 0x101;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_read",0x100,1,
                "Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d",handle,
                tpm_bytes,__n);
    }
  }
  else {
    ppuVar1 = &handle->recv_bytes;
    sVar9 = handle->recv_length;
    bVar3 = true;
    do {
      bVar10 = bVar3;
      if (__n <= sVar9) {
        memcpy(tpm_bytes,handle->recv_bytes,__n);
        sVar11 = handle->recv_length - __n;
        if (sVar11 == 0) {
          free(*ppuVar1);
          *ppuVar1 = (uchar *)0x0;
          handle->recv_length = 0;
          return 0;
        }
        if (sVar11 == 0xffffffffffffffff || handle->recv_length < __n) {
          return 0;
        }
        __dest = (uchar *)malloc(sVar11);
        puVar6 = handle->recv_bytes;
        memcpy(__dest,puVar6 + __n,sVar11);
        free(puVar6);
        handle->recv_bytes = __dest;
        handle->recv_length = sVar11;
        return 0;
      }
      sVar5 = recv(handle->socket_conn,local_438,0x400,0);
      if ((int)sVar5 == -1) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0010e616;
        pcVar8 = "Failure received bytes timed out.";
        iVar7 = 0xa2;
LAB_0010e60b:
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"read_socket_bytes",iVar7,1,pcVar8);
LAB_0010e616:
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          return 0x115;
        }
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"tpm_socket_read",0x114,1,"Failure reading socket bytes.");
        return 0x115;
      }
      __size = (ulong)(int)sVar5;
      if (*ppuVar1 != (uchar *)0x0) {
        sVar11 = 0xffffffffffffffff;
        if (!CARRY8(handle->recv_length,__size)) {
          sVar11 = handle->recv_length + __size;
        }
        if (sVar11 != 0xffffffffffffffff) {
          puVar6 = (uchar *)realloc(*ppuVar1,sVar11);
          goto LAB_0010e51f;
        }
LAB_0010e5e2:
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0010e616;
        pcVar8 = "Failure: adding bytes to buffer.";
        iVar7 = 0xb1;
        goto LAB_0010e60b;
      }
      puVar6 = (uchar *)malloc(__size);
LAB_0010e51f:
      if (puVar6 == (uchar *)0x0) goto LAB_0010e5e2;
      uVar2 = handle->recv_length;
      sVar9 = __size + uVar2;
      if (CARRY8(__size,uVar2)) {
        sVar9 = 0xffffffffffffffff;
      }
      if (sVar9 == 0xffffffffffffffff) {
        free(puVar6);
        goto LAB_0010e5e2;
      }
      handle->recv_bytes = puVar6;
      memcpy(puVar6 + uVar2,local_438,__size);
      handle->recv_length = sVar9;
      bVar3 = false;
    } while (bVar10);
    iVar7 = 0x106;
  }
  return iVar7;
}

Assistant:

int tpm_socket_read(TPM_SOCKET_HANDLE handle, unsigned char* tpm_bytes, uint32_t bytes_len)
{
    int result;
    if (handle == NULL || tpm_bytes == NULL || bytes_len == 0)
    {
        LogError("Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d", handle, tpm_bytes, bytes_len);
        result = MU_FAILURE;
    }
    else
    {
        // Do we have enough bytes cached
        result = MU_FAILURE;
        for (size_t index = 0; index < 2; index++)
        {
            if (handle->recv_length >= bytes_len)
            {
                memcpy(tpm_bytes, handle->recv_bytes, bytes_len);
                remove_from_buffer(handle, bytes_len);
                result = 0;
                break;
            }
            else
            {
                if (read_socket_bytes(handle))
                {
                    LogError("Failure reading socket bytes.");
                    result = MU_FAILURE;
                    break;
                }
            }
        }
    }
    return result;
}